

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::PreciseFunc2::~PreciseFunc2(PreciseFunc2 *this)

{
  CFloatFunc2::~CFloatFunc2(&this->super_CFloatFunc2);
  operator_delete(this,0x30);
  return;
}

Assistant:

PreciseFunc2	(const string& name, DoubleFunc2& func) : CFloatFunc2(name, func) {}